

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

run_container_t * run_container_clone(run_container_t *src)

{
  undefined4 uVar1;
  undefined4 uVar2;
  run_container_t *prVar3;
  
  prVar3 = run_container_create_given_capacity(src->capacity);
  if (prVar3 != (run_container_t *)0x0) {
    uVar1 = src->n_runs;
    uVar2 = src->capacity;
    prVar3->n_runs = uVar1;
    prVar3->capacity = uVar2;
    memcpy(prVar3->runs,src->runs,(long)(int)uVar1 << 2);
  }
  return prVar3;
}

Assistant:

ALLOW_UNALIGNED
run_container_t *run_container_clone(const run_container_t *src) {
    run_container_t *run = run_container_create_given_capacity(src->capacity);
    if (run == NULL) return NULL;
    run->capacity = src->capacity;
    run->n_runs = src->n_runs;
    memcpy(run->runs, src->runs, src->n_runs * sizeof(rle16_t));
    return run;
}